

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O3

void __thiscall QTipLabel::timerEvent(QTipLabel *this,QTimerEvent *e)

{
  int __fd;
  
  __fd = (int)e;
  if ((*(TimerId *)(e + 0x10) != (this->hideTimer).m_id) &&
     (*(TimerId *)(e + 0x10) != (this->expireTimer).m_id)) {
    return;
  }
  QBasicTimer::stop();
  QBasicTimer::stop();
  QWidget::close((QWidget *)this,__fd);
  QObject::deleteLater();
  return;
}

Assistant:

void QTipLabel::timerEvent(QTimerEvent *e)
{
    if (e->timerId() == hideTimer.timerId()
        || e->timerId() == expireTimer.timerId()){
        hideTimer.stop();
        expireTimer.stop();
        hideTipImmediately();
    }
}